

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkIvyFraig(Abc_Ntk_t *pNtk,int nConfLimit,int fDoSparse,int fProve,int fTransfer,int fVerbose)

{
  Ivy_Man_t *pManAig;
  Ivy_Man_t *pMan;
  Vec_Ptr_t *vCopies;
  Abc_Ntk_t *pNtkAig;
  Ivy_FraigParams_t Params;
  Ivy_FraigParams_t local_70;
  
  pNtkAig = (Abc_Ntk_t *)0x0;
  pManAig = Abc_NtkIvyBefore(pNtk,0,0);
  if (pManAig != (Ivy_Man_t *)0x0) {
    Ivy_FraigParamsDefault(&local_70);
    local_70.fProve = fProve;
    local_70.fVerbose = fVerbose;
    local_70.fDoSparse = fDoSparse;
    local_70.nBTLimitNode = nConfLimit;
    pMan = Ivy_FraigPerform(pManAig,&local_70);
    if (fTransfer == 1) {
      vCopies = Abc_NtkSaveCopy(pNtk);
      pNtkAig = Abc_NtkIvyAfter(pNtk,pMan,0,0);
      Abc_NtkLoadCopy(pNtk,vCopies);
      Vec_PtrFree(vCopies);
      Abc_NtkTransferPointers(pNtk,pNtkAig);
    }
    else {
      pNtkAig = Abc_NtkIvyAfter(pNtk,pMan,0,0);
    }
    Ivy_ManStop(pManAig);
    Ivy_ManStop(pMan);
  }
  return pNtkAig;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyFraig( Abc_Ntk_t * pNtk, int nConfLimit, int fDoSparse, int fProve, int fTransfer, int fVerbose )
{
    Ivy_FraigParams_t Params, * pParams = &Params; 
    Abc_Ntk_t * pNtkAig;
    Ivy_Man_t * pMan, * pTemp;
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
    Ivy_FraigParamsDefault( pParams );
    pParams->nBTLimitNode = nConfLimit;
    pParams->fVerbose     = fVerbose;
    pParams->fProve       = fProve;
    pParams->fDoSparse    = fDoSparse;
    pMan = Ivy_FraigPerform( pTemp = pMan, pParams );
    // transfer the pointers
    if ( fTransfer == 1 )
    {
        Vec_Ptr_t * vCopies;
        vCopies = Abc_NtkSaveCopy( pNtk );
        pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 0, 0 );
        Abc_NtkLoadCopy( pNtk, vCopies );
        Vec_PtrFree( vCopies );
        Abc_NtkTransferPointers( pNtk, pNtkAig );
    }
    else
        pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 0, 0 );
    Ivy_ManStop( pTemp );
    Ivy_ManStop( pMan );
    return pNtkAig;
}